

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_HistoryRecord::GetVectorValue(ON_HistoryRecord *this,int value_id,ON_3dVector *vector)

{
  int iVar1;
  ON_Value *pOVar2;
  ON_3dVector *pOVar3;
  ON_VectorValue *v;
  bool rc;
  ON_3dVector *vector_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  v._7_1_ = false;
  pOVar2 = FindValueHelper(this,value_id,6,false);
  if (pOVar2 != (ON_Value *)0x0) {
    iVar1 = ON_SimpleArray<ON_3dVector>::Count((ON_SimpleArray<ON_3dVector> *)(pOVar2 + 1));
    if (iVar1 == 1) {
      pOVar3 = ON_SimpleArray<ON_3dVector>::operator[]
                         ((ON_SimpleArray<ON_3dVector> *)(pOVar2 + 1),0);
      vector->x = pOVar3->x;
      vector->y = pOVar3->y;
      vector->z = pOVar3->z;
      v._7_1_ = true;
    }
  }
  return v._7_1_;
}

Assistant:

bool ON_HistoryRecord::GetVectorValue( int value_id, ON_3dVector& vector ) const
{
  bool rc = false;
  const ON_VectorValue* v = static_cast<ON_VectorValue*>(FindValueHelper(value_id,ON_Value::vector_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    vector = v->m_value[0];
    rc = true;
  }
  return rc;
}